

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

void N_VSpace_ManyVector(N_Vector v,sunindextype *lrw,sunindextype *liw)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_20 = in_RDI[2];
  *in_RSI = 0;
  *in_RDX = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < *(long *)*local_8; local_28 = local_28 + 1) {
    if (*(long *)(*(long *)(*(long *)(*(long *)(*local_8 + 0x10) + local_28 * 8) + 8) + 0x20) != 0)
    {
      N_VSpace(*(undefined8 *)(*(long *)(*local_8 + 0x10) + local_28 * 8),&local_30,&local_38);
      *local_10 = local_30 + *local_10;
      *local_18 = local_38 + *local_18;
    }
  }
  return;
}

Assistant:

void MVAPPEND(N_VSpace)(N_Vector v, sunindextype* lrw, sunindextype* liw)
{
  SUNFunctionBegin(v->sunctx);
  sunindextype i, lrw1, liw1;
  *lrw = 0;
  *liw = 0;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(v); i++)
  {
    /* update space requirements for this subvector (if 'nvspace' is implemented) */
    if ((MANYVECTOR_SUBVEC(v, i))->ops->nvspace != NULL)
    {
      N_VSpace(MANYVECTOR_SUBVEC(v, i), &lrw1, &liw1);
      SUNCheckLastErrVoid();
      *lrw += lrw1;
      *liw += liw1;
    }
  }
  return;
}